

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzelchdiv.cpp
# Opt level: O3

void __thiscall
TPZCompElHDiv<pzshape::TPZShapeLinear>::GetInterpolationOrder
          (TPZCompElHDiv<pzshape::TPZShapeLinear> *this,TPZVec<int> *ord)

{
  int iVar1;
  ulong uVar2;
  
  iVar1 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeLinear>).
                                 super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                 super_TPZCompEl + 0x90))();
  (*ord->_vptr_TPZVec[3])(ord,(long)iVar1);
  iVar1 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeLinear>).
                                 super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                 super_TPZCompEl + 0x90))(this);
  if (0 < iVar1) {
    uVar2 = 0;
    do {
      iVar1 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeLinear>).
                                     super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                     super_TPZCompEl + 0x3c0))(this,uVar2 & 0xffffffff);
      ord->fStore[uVar2] = iVar1;
      uVar2 = uVar2 + 1;
      iVar1 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeLinear>).
                                     super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                     super_TPZCompEl + 0x90))(this);
    } while ((long)uVar2 < (long)iVar1);
  }
  return;
}

Assistant:

void TPZCompElHDiv<TSHAPE>::GetInterpolationOrder(TPZVec<int> &ord) {
	ord.Resize(NConnects());
	int i;
	for(i=0; i<NConnects(); i++) {
		ord[i] = ConnectOrder(i);
	}
}